

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_check_collision_point_rec(rf_vec2 point,rf_rec rec)

{
  undefined1 local_21;
  undefined4 uStack_20;
  float fStack_1c;
  _Bool collision;
  rf_rec rec_local;
  rf_vec2 point_local;
  
  local_21 = false;
  rec_local.width = point.x;
  uStack_20 = rec.x;
  if ((((uStack_20 <= rec_local.width) &&
       (rec_local.x = rec.width, rec_local.width <= uStack_20 + rec_local.x)) &&
      (rec_local.height = point.y, fStack_1c = rec.y, fStack_1c <= rec_local.height)) &&
     (rec_local.y = rec.height, rec_local.height <= fStack_1c + rec_local.y)) {
    local_21 = true;
  }
  return local_21;
}

Assistant:

bool rf_check_collision_point_rec(rf_vec2 point, rf_rec rec)
{
    bool collision = 0;

    if ((point.x >= rec.x) && (point.x <= (rec.x + rec.width)) && (point.y >= rec.y) &&
        (point.y <= (rec.y + rec.height)))
        collision = 1;

    return collision;
}